

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O3

void __thiscall StackLattice_Join_Test::~StackLattice_Join_Test(StackLattice_Join_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(StackLattice, Join) {
  analysis::Stack stack{analysis::Flat<uint32_t>{}};
  auto& flat = stack.lattice;
  testDiamondJoin(stack,
                  {},
                  {flat.get(0)},
                  {flat.get(0), flat.get(1)},
                  {flat.get(0), flat.getTop()});
}